

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

bool __thiscall
es32cts::RobustBufferAccessBehavior::TexelFetchTest::verifyValidResults
          (TexelFetchTest *this,GLuint texture_id)

{
  ostringstream *poVar1;
  uchar uVar2;
  uchar uVar3;
  pointer out_data;
  GLuint i;
  int iVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  uint *puVar6;
  float *pfVar7;
  pointer puVar8;
  GLuint i_1;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  allocator<char> local_2f6;
  allocator<char> local_2f5;
  allocator<char> local_2f4;
  allocator<char> local_2f3;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  float local_2f0;
  float local_2ec;
  float local_2e8;
  float local_2e4;
  float local_2e0;
  float local_2dc;
  Texture destination_texture;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  Functions *gl;
  
  iVar4 = (*((this->super_TexelFetchTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar4);
  switch((this->super_TexelFetchTest).m_test_case) {
  case R8:
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pixels,0x400);
    for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9] = (uchar)lVar9;
    }
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,0,0x10,0x10,0x1908,0x1401,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
      if (uVar12 != pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar12 * 4]) {
        bVar13 = 0xff < uVar12;
        local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,". Expected value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," at offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        goto LAB_00c9211d;
      }
    }
    bVar13 = true;
    goto LAB_00c9211d;
  case RG8_SNORM:
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pixels,0x400);
    for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9 * 4] = (uchar)lVar9;
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9 * 4 + 1] = (uchar)lVar9;
    }
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,0,0x10,0x10,0x1908,0x1400,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
      uVar11 = (uint)uVar12 & 0xf;
      uVar10 = (uint)(uVar12 >> 4) & 0xfffffff;
      uVar2 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12 * 4];
      uVar3 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12 * 4 + 1];
      if ((uVar11 != (int)(char)uVar2) || (uVar10 != (int)(char)uVar3)) {
        bVar13 = 0xff < uVar12;
        local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid value: ");
        std::ostream::operator<<(poVar1,(int)(char)uVar2);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,(int)(char)uVar3);
        std::operator<<((ostream *)poVar1,". Expected value: ");
        std::ostream::operator<<(poVar1,uVar11);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,uVar10);
        std::operator<<((ostream *)poVar1,". At offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        goto LAB_00c9211d;
      }
    }
    bVar13 = true;
LAB_00c9211d:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    break;
  case R32UI_MULTISAMPLE:
    deqp::RobustBufferAccessBehavior::Program::Program
              ((Program *)&pixels,(this->super_TexelFetchTest).super_TestCase.m_context);
    deqp::RobustBufferAccessBehavior::Texture::Texture
              (&destination_texture,(this->super_TexelFetchTest).super_TestCase.m_context);
    deqp::RobustBufferAccessBehavior::Texture::Generate(gl,&destination_texture.m_id);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,destination_texture.m_id,0xde1);
    deqp::RobustBufferAccessBehavior::Texture::Storage(gl,0xde1,1,0x8236,0x10,0x10,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,
               "#version 320 es\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (binding = 1, r32ui) writeonly uniform lowp uimage2D   uni_destination_image;\nlayout (binding = 0, r32ui) readonly  uniform lowp uimage2DMS uni_source_image;\n\nvoid main()\n{\n    ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n    uint  index = gl_WorkGroupID.y * 16U + gl_WorkGroupID.x;\n\n    uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n    uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n    uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n    uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n\n    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(index + 3U))))\n    {\n        imageStore(uni_destination_image, point, uvec4(1U));\n    }\n    else\n    {\n        imageStore(uni_destination_image, point, uvec4(0U));\n    }\n}\n\n"
               ,&local_2f1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pixels_2,glcts::fixed_sample_locations_values + 1,&local_2f2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,glcts::fixed_sample_locations_values + 1,&local_2f3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,glcts::fixed_sample_locations_values + 1,&local_2f4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,glcts::fixed_sample_locations_values + 1,&local_2f5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,glcts::fixed_sample_locations_values + 1,&local_2f6);
    deqp::RobustBufferAccessBehavior::Program::Init
              ((Program *)&pixels,(string *)local_1b0,(string *)&pixels_2,&local_1f0,&local_210,
               &local_230,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&pixels_2);
    std::__cxx11::string::~string((string *)local_1b0);
    deqp::RobustBufferAccessBehavior::Program::Use((Program *)&pixels);
    (*gl->bindImageTexture)(0,texture_id,0,'\0',0,35000,0x8236);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                    ,0x2be);
    (*gl->bindImageTexture)(1,destination_texture.m_id,0,'\0',0,0x88b9,0x8236);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                    ,0x2c1);
    (*gl->dispatchCompute)(0x10,0x10,1);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                    ,0x2c4);
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&pixels_2,0x400);
    for (lVar9 = 0; lVar9 != 0x400; lVar9 = lVar9 + 1) {
      pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar9] = (uint)lVar9;
    }
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,destination_texture.m_id,0,0x10,0x10,0x8d99,0x1405,
               pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    puVar8 = pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
      if (*puVar8 != 1) {
        bVar13 = 0xff < uVar12;
        local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,". Expected value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," at offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        goto LAB_00c921c2;
      }
      puVar8 = puVar8 + 4;
    }
    bVar13 = true;
LAB_00c921c2:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    deqp::RobustBufferAccessBehavior::Texture::~Texture(&destination_texture);
    deqp::RobustBufferAccessBehavior::Program::~Program((Program *)&pixels);
    break;
  case RGBA32F:
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&pixels,0x400);
    pfVar7 = (float *)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
      fVar14 = (float)(int)lVar9 * 0.00390625;
      *pfVar7 = fVar14;
      pfVar7[1] = fVar14;
      pfVar7[2] = fVar14;
      pfVar7[3] = fVar14;
      pfVar7 = pfVar7 + 4;
    }
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,0,0x10,0x10,0x1908,0x1406,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    pfVar7 = (float *)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0xc);
    for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
      local_2e0 = (float)((uint)uVar12 & 0xf) * 0.0625;
      local_2e4 = (float)((uint)(uVar12 >> 4) & 0xfffffff) * 0.0625;
      local_2ec = (float)(int)(uint)uVar12 * 0.00390625;
      local_2dc = pfVar7[-3];
      fVar14 = pfVar7[-2];
      local_2e8 = pfVar7[-1];
      local_2f0 = *pfVar7;
      if (((((local_2e0 != local_2dc) || (NAN(local_2e0) || NAN(local_2dc))) ||
           (local_2e4 != fVar14)) || ((NAN(local_2e4) || NAN(fVar14) || (local_2ec != local_2e8))))
         || ((NAN(local_2ec) || NAN(local_2e8) || ((local_2f0 != 1.0 || (NAN(local_2f0))))))) {
        bVar13 = 0xff < uVar12;
        local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid value: ");
        std::ostream::operator<<(poVar1,local_2dc);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,fVar14);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,local_2e8);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,local_2f0);
        std::operator<<((ostream *)poVar1,". Expected value: ");
        std::ostream::operator<<(poVar1,local_2e0);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,local_2e4);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,local_2ec);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,1.0);
        std::operator<<((ostream *)poVar1,". At offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        goto LAB_00c921e4;
      }
      pfVar7 = pfVar7 + 4;
    }
    bVar13 = true;
LAB_00c921e4:
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&pixels);
    break;
  case R32UI_MIPMAP:
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels,0x400);
    out_data = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    memset(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0,0x1000);
    deqp::RobustBufferAccessBehavior::Texture::GetData
              (gl,texture_id,1,0x10,0x10,0x8d99,0x1405,out_data);
    deqp::RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    puVar6 = (uint *)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
      if (uVar12 != *puVar6) {
        bVar13 = 0xff < uVar12;
        local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,". Expected value: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," at offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        goto LAB_00c91fa7;
      }
      puVar6 = puVar6 + 4;
    }
    bVar13 = true;
LAB_00c91fa7:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels);
    break;
  default:
    bVar13 = true;
  }
  return bVar13;
}

Assistant:

bool TexelFetchTest::verifyValidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	if (R8 == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLubyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = (GLubyte)i;
		}

		Texture::GetData(gl, texture_id, 0 /* level */, width, height, GL_RGBA, GL_UNSIGNED_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLubyte expected_red = (GLubyte)i;
			const GLubyte drawn_red	= pixels[i * n_channels];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << (GLuint)drawn_red
													<< ". Expected value: " << (GLuint)expected_red
													<< " at offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RG8_SNORM == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLubyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLubyte)i;
			pixels[i * n_channels + 1] = (GLubyte)i;
		}

		Texture::GetData(gl, texture_id, 0 /* level */, width, height, GL_RGBA, GL_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLbyte expected_red   = (GLubyte)(i % 16);
			const GLbyte expected_green = (GLubyte)(i / 16);
			const GLbyte drawn_red		= pixels[i * n_channels + 0];
			const GLbyte drawn_green	= pixels[i * n_channels + 1];

			if ((expected_red != drawn_red) || (expected_green != drawn_green))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << (GLint)drawn_red << ", " << (GLint)drawn_green
					<< ". Expected value: " << (GLint)expected_red << ", " << (GLint)expected_green
					<< ". At offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::GetData(gl, texture_id, 0 /* level */, width, height, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = (GLfloat)(i % 16) / 16.0f;
			const GLfloat expected_green = (GLfloat)(i / 16) / 16.0f;
			const GLfloat expected_blue  = (GLfloat)i / 256.0f;
			const GLfloat expected_alpha = 1.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		deMemset(&pixels[0], 0, n_pixels * n_channels * sizeof(GLuint));

		Texture::GetData(gl, texture_id, 1 /* level */, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = i;
			const GLuint drawn_red	= pixels[i * n_channels];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MULTISAMPLE == m_test_case)
	{
		static const GLuint n_channels = 4;

		/* Compute Shader */
		static const GLchar* cs =
			"#version 320 es\n"
			"\n"
			"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
			"\n"
			"layout (binding = 1, r32ui) writeonly uniform lowp uimage2D   uni_destination_image;\n"
			"layout (binding = 0, r32ui) readonly  uniform lowp uimage2DMS uni_source_image;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n"
			"    uint  index = gl_WorkGroupID.y * 16U + gl_WorkGroupID.x;\n"
			"\n"
			"    uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n"
			"    uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n"
			"    uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n"
			"    uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n"
			"\n"
			"    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(index + 3U))))\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(1U));\n"
			"    }\n"
			"    else\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(0U));\n"
			"    }\n"
			"}\n"
			"\n";

		Program program(m_context);
		Texture destination_texture(m_context);

		Texture::Generate(gl, destination_texture.m_id);
		Texture::Bind(gl, destination_texture.m_id, GL_TEXTURE_2D);
		Texture::Storage(gl, GL_TEXTURE_2D, 1, GL_R32UI, width, height, 0 /* depth */);

		program.Init(cs, "", "", "", "", "");
		program.Use();
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
							GL_READ_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
		gl.bindImageTexture(1 /* unit */, destination_texture.m_id, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

		gl.dispatchCompute(16, 16, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Pixels buffer initialization */
		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels * n_channels; ++i)
		{
			pixels[i] = i;
		}

		Texture::GetData(gl, destination_texture.m_id, 0 /* level */, width, height, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
						 &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = 1;
			const GLuint drawn_red	= pixels[i * n_channels];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}